

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_membuf.c
# Opt level: O1

void membuff_resize(membuff_t *mb,size_t new_size)

{
  char *pcVar1;
  char *__ptr;
  
  if (mb->allocated_size < new_size) {
    __ptr = mb->buf;
    pcVar1 = (char *)realloc(__ptr,new_size);
    if (pcVar1 == (char *)0x0) {
      membuff_resize_cold_1();
      free(*(void **)__ptr);
      return;
    }
    mb->buf = pcVar1;
    mb->allocated_size = new_size;
  }
  return;
}

Assistant:

void membuff_resize(membuff_t *mb, size_t new_size) {
  if (new_size <= mb->allocated_size) return;
  char *newmem = (char *)realloc(mb->buf, new_size);
  if (newmem == NULL) {
    fprintf(stderr, "out of memory\n");
    exit(1);
  }
  mb->buf = newmem;
  mb->allocated_size = new_size;
}